

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_run_expired(multi_run_ctx *mrc)

{
  Curl_multi *multi;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  CURLMcode CVar5;
  CURLMcode CVar6;
  Curl_tree *pCVar7;
  Curl_easy *d;
  curltime i;
  curltime now;
  Curl_tree *t;
  Curl_tree *local_38;
  
  multi = mrc->multi;
  local_38 = (Curl_tree *)0x0;
  CVar5 = CURLM_OK;
  do {
    do {
      while( true ) {
        do {
          uVar1 = (mrc->now).tv_sec;
          uVar2 = (mrc->now).tv_usec;
          i.tv_usec = uVar2;
          i.tv_sec = uVar1;
          i._12_4_ = 0;
          pCVar7 = Curl_splaygetbest(i,multi->timetree,&local_38);
          multi->timetree = pCVar7;
          if (local_38 == (Curl_tree *)0x0) {
            return CVar5;
          }
          d = (Curl_easy *)Curl_splayget(local_38);
        } while (d == (Curl_easy *)0x0);
        uVar3 = (mrc->now).tv_sec;
        uVar4 = (mrc->now).tv_usec;
        now.tv_usec = uVar4;
        now.tv_sec = uVar3;
        now._12_4_ = 0;
        add_next_timeout(now,multi,d);
        if (d != multi->admin) break;
        mrc->run_cpool = true;
      }
      mrc->run_xfers = mrc->run_xfers + 1;
      sigpipe_apply(d,&mrc->pipe_st);
      CVar5 = multi_runsingle(multi,&mrc->now,d);
    } while (CURLM_OK < CVar5);
    CVar6 = Curl_multi_ev_assess_xfer(multi,d);
    CVar5 = CURLM_OK;
  } while (CVar6 == CURLM_OK);
  return CVar6;
}

Assistant:

static CURLMcode multi_run_expired(struct multi_run_ctx *mrc)
{
  struct Curl_multi *multi = mrc->multi;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t = NULL;
  CURLMcode result = CURLM_OK;

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process (compared to mrc->now) in the splay and 'data' will be
   * re-assigned for every expired handle we deal with.
   */
  while(1) {
    /* Check if there is one (more) expired timer to deal with! This function
       extracts a matching node if there is one */
    multi->timetree = Curl_splaygetbest(mrc->now, multi->timetree, &t);
    if(!t)
      goto out;

    data = Curl_splayget(t); /* assign this for next loop */
    if(!data)
      continue;

    (void)add_next_timeout(mrc->now, multi, data);
    if(data == multi->admin) {
      mrc->run_cpool = TRUE;
      continue;
    }

    mrc->run_xfers++;
    sigpipe_apply(data, &mrc->pipe_st);
    result = multi_runsingle(multi, &mrc->now, data);

    if(CURLM_OK >= result) {
      /* reassess event handling of data */
      result = Curl_multi_ev_assess_xfer(multi, data);
      if(result)
        goto out;
    }
  }

out:
  return result;
}